

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O1

bool __thiscall avro::Validator::getNextFieldName(Validator *this,string *name)

{
  pointer pCVar1;
  element_type *peVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  name->_M_string_length = 0;
  *(name->_M_dataplus)._M_p = '\0';
  uVar3 = (-1 - (uint)((uint)(this->nextType_ + ~AVRO_NULL) < 6)) +
          (int)((long)(this->compoundStack_).
                      super__Vector_base<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->compoundStack_).
                      super__Vector_base<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (-1 < (int)uVar3) {
    uVar3 = uVar3 & 0x7fffffff;
    pCVar1 = (this->compoundStack_).
             super__Vector_base<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = pCVar1[uVar3].node.px;
    if (peVar2->type_ == AVRO_RECORD) {
      pCVar1 = pCVar1 + uVar3;
      uVar5 = pCVar1->pos - 1;
      uVar4 = (**(code **)((long)peVar2->_vptr_Node + 0x20))();
      if (uVar5 >= uVar4) {
        return uVar5 < uVar4;
      }
      peVar2 = (pCVar1->node).px;
      (**(code **)((long)peVar2->_vptr_Node + 0x40))(peVar2,uVar5 & 0xffffffff);
      std::__cxx11::string::_M_assign((string *)name);
      return true;
    }
  }
  return false;
}

Assistant:

void Validator::advance()
{
    if(!waitingForCount_) {
        doAdvance();
    }
}